

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall
cmCursesMainForm::cmCursesMainForm
          (cmCursesMainForm *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,int initWidth)

{
  char *pcVar1;
  cmake *pcVar2;
  string *s;
  reference pvVar3;
  undefined1 local_c8 [8];
  string whereCMake;
  value_type local_a0;
  allocator local_79;
  value_type local_78;
  allocator local_51;
  value_type local_50;
  int local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  int initWidth_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCursesMainForm *this_local;
  
  local_1c = initWidth;
  pvStack_18 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  cmCursesForm::cmCursesForm(&this->super_cmCursesForm);
  (this->super_cmCursesForm)._vptr_cmCursesForm = (_func_int **)&PTR__cmCursesMainForm_00a4fb50;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Errors);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Args,pvStack_18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->HelpMessage);
  std::__cxx11::string::string((string *)&this->WhereSource);
  std::__cxx11::string::string((string *)&this->WhereCMake);
  this->InitialWidth = local_1c;
  std::__cxx11::string::string((string *)&this->SearchString);
  std::__cxx11::string::string((string *)&this->OldSearchString);
  this->NumberOfPages = 0;
  this->Fields = (FIELD **)0x0;
  this->Entries =
       (vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *)0x0;
  this->AdvancedMode = false;
  this->NumberOfVisibleEntries = 0;
  this->OkToGenerate = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"Welcome to ccmake, curses based user interface for CMake.",
             &local_51);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->HelpMessage,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"",&local_79);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->HelpMessage,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  pcVar1 = s_ConstHelpMessage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,pcVar1,(allocator *)(whereCMake.field_2._M_local_buf + 0xf));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->HelpMessage,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)(whereCMake.field_2._M_local_buf + 0xf));
  pcVar2 = (cmake *)operator_new(0x260);
  cmake::cmake(pcVar2);
  this->CMakeInstance = pcVar2;
  pcVar2 = this->CMakeInstance;
  s = cmSystemTools::GetCMakeCursesCommand_abi_cxx11_();
  cmake::SetCMakeEditCommand(pcVar2,s);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->Args,0);
  cmsys::SystemTools::GetProgramPath((string *)local_c8,pvVar3);
  std::__cxx11::string::operator+=((string *)local_c8,"/cmake");
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->Args,0);
  std::__cxx11::string::operator=((string *)pvVar3,(string *)local_c8);
  cmake::SetArgs(this->CMakeInstance,&this->Args,false);
  std::__cxx11::string::operator=((string *)&this->SearchString,"");
  std::__cxx11::string::operator=((string *)&this->OldSearchString,"");
  this->SearchMode = false;
  std::__cxx11::string::~string((string *)local_c8);
  return;
}

Assistant:

cmCursesMainForm::cmCursesMainForm(std::vector<std::string> const& args,
                                   int initWidth) :
  Args(args), InitialWidth(initWidth)
{
  this->NumberOfPages = 0;
  this->Fields = 0;
  this->Entries = 0;
  this->AdvancedMode = false;
  this->NumberOfVisibleEntries = 0;
  this->OkToGenerate = false;
  this->HelpMessage.push_back("Welcome to ccmake, curses based user interface for CMake.");
  this->HelpMessage.push_back("");
  this->HelpMessage.push_back(s_ConstHelpMessage);
  this->CMakeInstance = new cmake;
  this->CMakeInstance->SetCMakeEditCommand(
    cmSystemTools::GetCMakeCursesCommand());

  // create the arguments for the cmake object
  std::string whereCMake = cmSystemTools::GetProgramPath(this->Args[0]);
  whereCMake += "/cmake";
  this->Args[0] = whereCMake;
  this->CMakeInstance->SetArgs(this->Args);
  this->SearchString = "";
  this->OldSearchString = "";
  this->SearchMode = false;
}